

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

string * build_grammar_abi_cxx11_
                   (function<void_(const_common_grammar_builder_&)> *cb,
                   common_grammar_options *options)

{
  SchemaConverter *in_RDI;
  common_grammar_builder builder;
  SchemaConverter converter;
  common_grammar_builder *__args;
  SchemaConverter *this;
  SchemaConverter *this_00;
  undefined1 in_stack_fffffffffffffe97;
  _Base_ptr in_stack_fffffffffffffe98;
  SchemaConverter *in_stack_fffffffffffffea0;
  undefined8 in_stack_ffffffffffffff10;
  SchemaConverter *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RDI;
  std::
  function<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>(std::__cxx11::string_const&)>
  ::
  function<build_grammar(std::function<void(common_grammar_builder_const&)>const&,common_grammar_options_const&)::__0,void>
            (&in_RDI->_fetch_json,(anon_class_1_0_00000001 *)in_RDI);
  SchemaConverter::SchemaConverter
            (in_stack_fffffffffffffea0,
             (function<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffe98,(bool)in_stack_fffffffffffffe97);
  std::
  function<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x343ee5);
  __args = (common_grammar_builder *)&stack0xfffffffffffffef0;
  this = (SchemaConverter *)&stack0xfffffffffffffe58;
  std::function<std::__cxx11::string(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<build_grammar(std::function<void(common_grammar_builder_const&)>const&,common_grammar_options_const&)::__1,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00,(anon_class_8_1_00c01040 *)in_RDI);
  std::
  function<std::__cxx11::string(std::__cxx11::string_const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&)>
  ::
  function<build_grammar(std::function<void(common_grammar_builder_const&)>const&,common_grammar_options_const&)::__2,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)this_00,(anon_class_8_1_00c01040 *)in_RDI);
  std::
  function<void(nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>
  ::
  function<build_grammar(std::function<void(common_grammar_builder_const&)>const&,common_grammar_options_const&)::__3,void>
            ((function<void_(nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)this_00,(anon_class_8_1_00c01040 *)in_RDI);
  std::function<void_(const_common_grammar_builder_&)>::operator()
            ((function<void_(const_common_grammar_builder_&)> *)this,__args);
  SchemaConverter::check_errors((SchemaConverter *)in_stack_ffffffffffffff10);
  SchemaConverter::format_grammar_abi_cxx11_(this_01);
  common_grammar_builder::~common_grammar_builder((common_grammar_builder *)this);
  SchemaConverter::~SchemaConverter(this);
  return (string *)this_00;
}

Assistant:

std::string build_grammar(const std::function<void(const common_grammar_builder &)> & cb, const common_grammar_options & options) {
    SchemaConverter converter([&](const std::string &) { return json(); }, options.dotall);
    common_grammar_builder builder {
        /* .add_rule = */ [&](const std::string & name, const std::string & rule) {
            return converter._add_rule(name, rule);
        },
        /* .add_schema = */ [&](const std::string & name, const nlohmann::ordered_json & schema) {
            return converter.visit(schema, name == "root" ? "" : name);
        },
        /* .resolve_refs = */ [&](nlohmann::ordered_json & schema) {
            converter.resolve_refs(schema, "");
        }
    };
    cb(builder);
    converter.check_errors();
    return converter.format_grammar();
}